

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O3

void iadst16_low1_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i alVar5;
  undefined1 auVar6 [32];
  __m256i alVar7;
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  __m256i alVar11;
  undefined1 auVar12 [32];
  int iVar13;
  int iVar14;
  long lVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  __m256i alVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  
  lVar15 = (long)bit * 0x100;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar15 + 0x168);
  auVar16._4_4_ = uVar1;
  auVar16._0_4_ = uVar1;
  auVar16._8_4_ = uVar1;
  auVar16._12_4_ = uVar1;
  auVar16._16_4_ = uVar1;
  auVar16._20_4_ = uVar1;
  auVar16._24_4_ = uVar1;
  auVar16._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar15 + 600);
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  auVar17._16_4_ = uVar1;
  auVar17._20_4_ = uVar1;
  auVar17._24_4_ = uVar1;
  auVar17._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar15 + 0x180);
  auVar18._4_4_ = uVar1;
  auVar18._0_4_ = uVar1;
  auVar18._8_4_ = uVar1;
  auVar18._12_4_ = uVar1;
  auVar18._16_4_ = uVar1;
  auVar18._20_4_ = uVar1;
  auVar18._24_4_ = uVar1;
  auVar18._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar15 + 0x240);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  auVar26._16_4_ = uVar1;
  auVar26._20_4_ = uVar1;
  auVar26._24_4_ = uVar1;
  auVar26._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar15 + 0x220);
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  auVar24._16_4_ = uVar1;
  auVar24._20_4_ = uVar1;
  auVar24._24_4_ = uVar1;
  auVar24._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar15 + 0x1a0);
  auVar19._4_4_ = uVar1;
  auVar19._0_4_ = uVar1;
  auVar19._8_4_ = uVar1;
  auVar19._12_4_ = uVar1;
  auVar19._16_4_ = uVar1;
  auVar19._20_4_ = uVar1;
  auVar19._24_4_ = uVar1;
  auVar19._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar15 + 0x1e0);
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  auVar23._16_4_ = uVar1;
  auVar23._20_4_ = uVar1;
  auVar23._24_4_ = uVar1;
  auVar23._28_4_ = uVar1;
  iVar14 = 1 << ((char)bit - 1U & 0x1f);
  auVar22._4_4_ = iVar14;
  auVar22._0_4_ = iVar14;
  auVar22._8_4_ = iVar14;
  auVar22._12_4_ = iVar14;
  auVar22._16_4_ = iVar14;
  auVar22._20_4_ = iVar14;
  auVar22._24_4_ = iVar14;
  auVar22._28_4_ = iVar14;
  auVar17 = vpmulld_avx2((undefined1  [32])*in,auVar17);
  auVar17 = vpaddd_avx2(auVar17,auVar22);
  alVar2 = (__m256i)vpsrad_avx2(auVar17,ZEXT416((uint)bit));
  auVar17 = vpmulld_avx2((undefined1  [32])*in,auVar16);
  auVar17 = vpsubd_avx2(auVar22,auVar17);
  auVar3 = vpsrad_avx2(auVar17,ZEXT416((uint)bit));
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar18);
  auVar16 = vpmulld_avx2(auVar3,auVar26);
  auVar17 = vpaddd_avx2(auVar17,auVar22);
  auVar17 = vpaddd_avx2(auVar16,auVar17);
  auVar20 = ZEXT416((uint)bit);
  auVar4 = vpsrad_avx2(auVar17,auVar20);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar26);
  auVar16 = vpmulld_avx2(auVar18,auVar3);
  auVar17 = vpaddd_avx2(auVar17,auVar22);
  auVar17 = vpsubd_avx2(auVar17,auVar16);
  alVar5 = (__m256i)vpsrad_avx2(auVar17,auVar20);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar19);
  auVar16 = vpmulld_avx2(auVar3,auVar24);
  auVar17 = vpaddd_avx2(auVar17,auVar22);
  auVar17 = vpaddd_avx2(auVar16,auVar17);
  auVar6 = vpsrad_avx2(auVar17,auVar20);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar2,auVar24);
  auVar16 = vpmulld_avx2(auVar19,auVar3);
  auVar17 = vpaddd_avx2(auVar17,auVar22);
  auVar17 = vpsubd_avx2(auVar17,auVar16);
  alVar7 = (__m256i)vpsrad_avx2(auVar17,auVar20);
  auVar17 = vpmulld_avx2(auVar4,auVar19);
  auVar16 = vpmulld_avx2((undefined1  [32])alVar5,auVar24);
  auVar17 = vpaddd_avx2(auVar17,auVar22);
  auVar17 = vpaddd_avx2(auVar17,auVar16);
  auVar16 = vpmulld_avx2(auVar4,auVar24);
  auVar18 = vpmulld_avx2(auVar19,(undefined1  [32])alVar5);
  auVar16 = vpaddd_avx2(auVar16,auVar22);
  auVar12 = vpsubd_avx2(auVar16,auVar18);
  auVar16 = vpmulld_avx2((undefined1  [32])alVar2,auVar23);
  auVar24 = vpmulld_avx2(auVar3,auVar23);
  auVar16 = vpaddd_avx2(auVar16,auVar22);
  auVar18 = vpaddd_avx2(auVar24,auVar16);
  auVar25 = vpsubd_avx2(auVar16,auVar24);
  auVar16 = vpmulld_avx2(auVar6,auVar23);
  auVar19 = vpmulld_avx2((undefined1  [32])alVar7,auVar23);
  auVar16 = vpaddd_avx2(auVar16,auVar22);
  auVar24 = vpaddd_avx2(auVar16,auVar19);
  auVar27 = vpsubd_avx2(auVar16,auVar19);
  auVar16 = vpmulld_avx2(auVar4,auVar23);
  auVar16 = vpaddd_avx2(auVar16,auVar22);
  auVar26 = vpmulld_avx2((undefined1  [32])alVar5,auVar23);
  auVar19 = vpaddd_avx2(auVar16,auVar26);
  auVar28 = vpsubd_avx2(auVar16,auVar26);
  auVar20 = ZEXT416((uint)bit);
  alVar8 = (__m256i)vpsrad_avx2(auVar17,auVar20);
  auVar17 = vpmulld_avx2((undefined1  [32])alVar8,auVar23);
  auVar17 = vpaddd_avx2(auVar17,auVar22);
  auVar12 = vpsrad_avx2(auVar12,auVar20);
  auVar26 = vpmulld_avx2(auVar12,auVar23);
  auVar16 = vpaddd_avx2(auVar17,auVar26);
  auVar26 = vpsubd_avx2(auVar17,auVar26);
  auVar17 = vpsrad_avx2(auVar18,auVar20);
  alVar9 = (__m256i)vpsrad_avx2(auVar25,auVar20);
  alVar10 = (__m256i)vpsrad_avx2(auVar24,auVar20);
  auVar18 = vpsrad_avx2(auVar27,auVar20);
  alVar11 = (__m256i)vpsrad_avx2(auVar19,auVar20);
  auVar24 = vpsrad_avx2(auVar28,auVar20);
  auVar16 = vpsrad_avx2(auVar16,ZEXT416((uint)bit));
  alVar21 = (__m256i)vpsrad_avx2(auVar26,ZEXT416((uint)bit));
  if (do_cols == 0) {
    iVar14 = 10;
    if (10 < bd) {
      iVar14 = bd;
    }
    iVar14 = 0x20 << ((byte)iVar14 & 0x1f);
    iVar13 = -iVar14;
    auVar25._4_4_ = iVar13;
    auVar25._0_4_ = iVar13;
    auVar25._8_4_ = iVar13;
    auVar25._12_4_ = iVar13;
    auVar25._16_4_ = iVar13;
    auVar25._20_4_ = iVar13;
    auVar25._24_4_ = iVar13;
    auVar25._28_4_ = iVar13;
    iVar14 = iVar14 + -1;
    iVar13 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    auVar28._4_4_ = iVar13;
    auVar28._0_4_ = iVar13;
    auVar28._8_4_ = iVar13;
    auVar28._12_4_ = iVar13;
    auVar28._16_4_ = iVar13;
    auVar28._20_4_ = iVar13;
    auVar28._24_4_ = iVar13;
    auVar28._28_4_ = iVar13;
    auVar19 = vpaddd_avx2((undefined1  [32])alVar2,auVar28);
    auVar19 = vpsrad_avx2(auVar19,ZEXT416((uint)out_shift));
    auVar27._4_4_ = iVar14;
    auVar27._0_4_ = iVar14;
    auVar27._8_4_ = iVar14;
    auVar27._12_4_ = iVar14;
    auVar27._16_4_ = iVar14;
    auVar27._20_4_ = iVar14;
    auVar27._24_4_ = iVar14;
    auVar27._28_4_ = iVar14;
    auVar19 = vpmaxsd_avx2(auVar19,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar19,auVar27);
    *out = alVar2;
    auVar19 = vpsubd_avx2(auVar28,auVar4);
    auVar19 = vpsrad_avx2(auVar19,ZEXT416((uint)out_shift));
    auVar19 = vpmaxsd_avx2(auVar19,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar19,auVar27);
    auVar19 = vpaddd_avx2((undefined1  [32])alVar8,auVar28);
    auVar20 = ZEXT416((uint)out_shift);
    auVar19 = vpsrad_avx2(auVar19,auVar20);
    out[1] = alVar2;
    auVar19 = vpmaxsd_avx2(auVar19,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar19,auVar27);
    out[2] = alVar2;
    auVar19 = vpsubd_avx2(auVar28,auVar6);
    auVar19 = vpsrad_avx2(auVar19,auVar20);
    auVar19 = vpmaxsd_avx2(auVar19,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar19,auVar27);
    auVar19 = vpaddd_avx2(auVar28,(undefined1  [32])alVar10);
    auVar19 = vpsrad_avx2(auVar19,auVar20);
    out[3] = alVar2;
    auVar19 = vpmaxsd_avx2(auVar19,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar19,auVar27);
    out[4] = alVar2;
    auVar16 = vpsubd_avx2(auVar28,auVar16);
    auVar16 = vpsrad_avx2(auVar16,auVar20);
    auVar16 = vpmaxsd_avx2(auVar16,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar16,auVar27);
    auVar16 = vpaddd_avx2((undefined1  [32])alVar11,auVar28);
    auVar20 = ZEXT416((uint)out_shift);
    auVar16 = vpsrad_avx2(auVar16,auVar20);
    out[5] = alVar2;
    auVar16 = vpmaxsd_avx2(auVar16,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar16,auVar27);
    out[6] = alVar2;
    auVar17 = vpsubd_avx2(auVar28,auVar17);
    auVar17 = vpsrad_avx2(auVar17,auVar20);
    auVar17 = vpmaxsd_avx2(auVar17,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar27);
    auVar17 = vpaddd_avx2((undefined1  [32])alVar9,auVar28);
    auVar17 = vpsrad_avx2(auVar17,auVar20);
    out[7] = alVar2;
    auVar17 = vpmaxsd_avx2(auVar17,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar27);
    out[8] = alVar2;
    auVar17 = vpsubd_avx2(auVar28,auVar24);
    auVar17 = vpsrad_avx2(auVar17,auVar20);
    auVar17 = vpmaxsd_avx2(auVar17,auVar25);
    alVar2 = (__m256i)vpminsd_avx2(auVar17,auVar27);
    out[9] = alVar2;
    auVar17 = vpaddd_avx2(auVar28,(undefined1  [32])alVar21);
    auVar24 = vpsubd_avx2(auVar28,auVar18);
    auVar16 = vpaddd_avx2(auVar28,(undefined1  [32])alVar7);
    auVar26 = vpsubd_avx2(auVar28,auVar12);
    auVar18 = vpaddd_avx2(auVar28,(undefined1  [32])alVar5);
    auVar4 = vpsubd_avx2(auVar28,auVar3);
    auVar17 = vpsrad_avx2(auVar17,auVar20);
    auVar24 = vpsrad_avx2(auVar24,auVar20);
    auVar19 = vpsrad_avx2(auVar16,auVar20);
    auVar26 = vpsrad_avx2(auVar26,auVar20);
    auVar3 = vpsrad_avx2(auVar18,ZEXT416((uint)out_shift));
    auVar4 = vpsrad_avx2(auVar4,ZEXT416((uint)out_shift));
    auVar17 = vpmaxsd_avx2(auVar17,auVar25);
    auVar16 = vpmaxsd_avx2(auVar24,auVar25);
    auVar18 = vpmaxsd_avx2(auVar19,auVar25);
    auVar24 = vpmaxsd_avx2(auVar26,auVar25);
    auVar19 = vpmaxsd_avx2(auVar3,auVar25);
    auVar26 = vpmaxsd_avx2(auVar4,auVar25);
    alVar21 = (__m256i)vpminsd_avx2(auVar17,auVar27);
    alVar2 = (__m256i)vpminsd_avx2(auVar16,auVar27);
    alVar7 = (__m256i)vpminsd_avx2(auVar18,auVar27);
    alVar8 = (__m256i)vpminsd_avx2(auVar24,auVar27);
    alVar5 = (__m256i)vpminsd_avx2(auVar19,auVar27);
    alVar9 = (__m256i)vpminsd_avx2(auVar26,auVar27);
  }
  else {
    *out = alVar2;
    auVar19 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    alVar2 = (__m256i)vpsubd_avx2(auVar19,auVar4);
    out[1] = alVar2;
    out[2] = alVar8;
    alVar2 = (__m256i)vpsubd_avx2(auVar19,auVar6);
    out[3] = alVar2;
    out[4] = alVar10;
    alVar2 = (__m256i)vpsubd_avx2(auVar19,auVar16);
    out[5] = alVar2;
    out[6] = alVar11;
    alVar2 = (__m256i)vpsubd_avx2(auVar19,auVar17);
    out[7] = alVar2;
    out[8] = alVar9;
    alVar2 = (__m256i)vpsubd_avx2(auVar19,auVar24);
    out[9] = alVar2;
    alVar2 = (__m256i)vpsubd_avx2(auVar19,auVar18);
    alVar8 = (__m256i)vpsubd_avx2(auVar19,auVar12);
    alVar9 = (__m256i)vpsubd_avx2(auVar19,auVar3);
  }
  out[10] = alVar21;
  out[0xb] = alVar2;
  out[0xc] = alVar7;
  out[0xd] = alVar8;
  out[0xe] = alVar5;
  out[0xf] = alVar9;
  return;
}

Assistant:

static void iadst16_low1_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                              int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi2 = _mm256_set1_epi32(cospi[2]);
  const __m256i cospi62 = _mm256_set1_epi32(cospi[62]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const __m256i zero = _mm256_setzero_si256();
  __m256i v[16], x, y, temp1, temp2;

  // Calculate the column 0, 1, 2, 3
  {
    // stage 0
    // stage 1
    // stage 2
    x = _mm256_mullo_epi32(in[0], cospi62);
    v[0] = _mm256_add_epi32(x, rnding);
    v[0] = _mm256_srai_epi32(v[0], bit);

    x = _mm256_mullo_epi32(in[0], cospi2);
    v[1] = _mm256_sub_epi32(zero, x);
    v[1] = _mm256_add_epi32(v[1], rnding);
    v[1] = _mm256_srai_epi32(v[1], bit);

    // stage 3
    v[8] = v[0];
    v[9] = v[1];

    // stage 4
    temp1 = _mm256_mullo_epi32(v[8], cospi8);
    x = _mm256_mullo_epi32(v[9], cospi56);
    temp1 = _mm256_add_epi32(temp1, x);
    temp1 = _mm256_add_epi32(temp1, rnding);
    temp1 = _mm256_srai_epi32(temp1, bit);

    temp2 = _mm256_mullo_epi32(v[8], cospi56);
    x = _mm256_mullo_epi32(v[9], cospi8);
    temp2 = _mm256_sub_epi32(temp2, x);
    temp2 = _mm256_add_epi32(temp2, rnding);
    temp2 = _mm256_srai_epi32(temp2, bit);
    v[8] = temp1;
    v[9] = temp2;

    // stage 5
    v[4] = v[0];
    v[5] = v[1];
    v[12] = v[8];
    v[13] = v[9];

    // stage 6
    temp1 = _mm256_mullo_epi32(v[4], cospi16);
    x = _mm256_mullo_epi32(v[5], cospi48);
    temp1 = _mm256_add_epi32(temp1, x);
    temp1 = _mm256_add_epi32(temp1, rnding);
    temp1 = _mm256_srai_epi32(temp1, bit);

    temp2 = _mm256_mullo_epi32(v[4], cospi48);
    x = _mm256_mullo_epi32(v[5], cospi16);
    temp2 = _mm256_sub_epi32(temp2, x);
    temp2 = _mm256_add_epi32(temp2, rnding);
    temp2 = _mm256_srai_epi32(temp2, bit);
    v[4] = temp1;
    v[5] = temp2;

    temp1 = _mm256_mullo_epi32(v[12], cospi16);
    x = _mm256_mullo_epi32(v[13], cospi48);
    temp1 = _mm256_add_epi32(temp1, x);
    temp1 = _mm256_add_epi32(temp1, rnding);
    temp1 = _mm256_srai_epi32(temp1, bit);

    temp2 = _mm256_mullo_epi32(v[12], cospi48);
    x = _mm256_mullo_epi32(v[13], cospi16);
    temp2 = _mm256_sub_epi32(temp2, x);
    temp2 = _mm256_add_epi32(temp2, rnding);
    temp2 = _mm256_srai_epi32(temp2, bit);
    v[12] = temp1;
    v[13] = temp2;

    // stage 7
    v[2] = v[0];
    v[3] = v[1];
    v[6] = v[4];
    v[7] = v[5];
    v[10] = v[8];
    v[11] = v[9];
    v[14] = v[12];
    v[15] = v[13];

    // stage 8
    y = _mm256_mullo_epi32(v[2], cospi32);
    x = _mm256_mullo_epi32(v[3], cospi32);
    v[2] = _mm256_add_epi32(y, x);
    v[2] = _mm256_add_epi32(v[2], rnding);
    v[2] = _mm256_srai_epi32(v[2], bit);

    v[3] = _mm256_sub_epi32(y, x);
    v[3] = _mm256_add_epi32(v[3], rnding);
    v[3] = _mm256_srai_epi32(v[3], bit);

    y = _mm256_mullo_epi32(v[6], cospi32);
    x = _mm256_mullo_epi32(v[7], cospi32);
    v[6] = _mm256_add_epi32(y, x);
    v[6] = _mm256_add_epi32(v[6], rnding);
    v[6] = _mm256_srai_epi32(v[6], bit);

    v[7] = _mm256_sub_epi32(y, x);
    v[7] = _mm256_add_epi32(v[7], rnding);
    v[7] = _mm256_srai_epi32(v[7], bit);

    y = _mm256_mullo_epi32(v[10], cospi32);
    x = _mm256_mullo_epi32(v[11], cospi32);
    v[10] = _mm256_add_epi32(y, x);
    v[10] = _mm256_add_epi32(v[10], rnding);
    v[10] = _mm256_srai_epi32(v[10], bit);

    v[11] = _mm256_sub_epi32(y, x);
    v[11] = _mm256_add_epi32(v[11], rnding);
    v[11] = _mm256_srai_epi32(v[11], bit);

    y = _mm256_mullo_epi32(v[14], cospi32);
    x = _mm256_mullo_epi32(v[15], cospi32);
    v[14] = _mm256_add_epi32(y, x);
    v[14] = _mm256_add_epi32(v[14], rnding);
    v[14] = _mm256_srai_epi32(v[14], bit);

    v[15] = _mm256_sub_epi32(y, x);
    v[15] = _mm256_add_epi32(v[15], rnding);
    v[15] = _mm256_srai_epi32(v[15], bit);

    // stage 9
    if (do_cols) {
      out[0] = v[0];
      out[1] = _mm256_sub_epi32(_mm256_setzero_si256(), v[8]);
      out[2] = v[12];
      out[3] = _mm256_sub_epi32(_mm256_setzero_si256(), v[4]);
      out[4] = v[6];
      out[5] = _mm256_sub_epi32(_mm256_setzero_si256(), v[14]);
      out[6] = v[10];
      out[7] = _mm256_sub_epi32(_mm256_setzero_si256(), v[2]);
      out[8] = v[3];
      out[9] = _mm256_sub_epi32(_mm256_setzero_si256(), v[11]);
      out[10] = v[15];
      out[11] = _mm256_sub_epi32(_mm256_setzero_si256(), v[7]);
      out[12] = v[5];
      out[13] = _mm256_sub_epi32(_mm256_setzero_si256(), v[13]);
      out[14] = v[9];
      out[15] = _mm256_sub_epi32(_mm256_setzero_si256(), v[1]);
    } else {
      const int log_range_out = AOMMAX(16, bd + 6);
      const __m256i clamp_lo_out =
          _mm256_set1_epi32(-(1 << (log_range_out - 1)));
      const __m256i clamp_hi_out =
          _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);

      neg_shift_avx2(v[0], v[8], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
      neg_shift_avx2(v[12], v[4], out + 2, out + 3, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[6], v[14], out + 4, out + 5, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[10], v[2], out + 6, out + 7, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[3], v[11], out + 8, out + 9, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[15], v[7], out + 10, out + 11, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[5], v[13], out + 12, out + 13, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(v[9], v[1], out + 14, out + 15, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    }
  }
}